

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase139::run(TestCase139 *this)

{
  bool bVar1;
  TestObject *firstElement;
  TestObject *ptrCopy;
  Array<kj::(anonymous_namespace)::TestObject> array;
  DebugComparison<int,_int_&> _kjCondition;
  NullableValue<kj::Exception> local_4f8;
  Maybe<kj::Exception> local_360 [2];
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  firstElement = (TestObject *)
                 _::HeapArrayDisposer::allocateImpl
                           (4,0x20,0x20,
                            _::HeapArrayDisposer::Allocate_<kj::(anonymous_namespace)::TestObject>::
                            construct,
                            ArrayDisposer::Dispose_<kj::(anonymous_namespace)::TestObject>::destruct
                           );
  array.size_ = 0x20;
  _kjCondition.result = (anonymous_namespace)::TestObject::count == 0x20;
  _kjCondition.left = 0x20;
  _kjCondition.right = &(anonymous_namespace)::TestObject::count;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (_::Debug::minSeverity < 3)) {
    local_4f8.isSet = true;
    local_4f8._1_3_ = 0;
    _::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x90,ERROR,
               "\"failed: expected \" \"(32) == (TestObject::count)\", _kjCondition, 32, TestObject::count"
               ,(char (*) [45])"failed: expected (32) == (TestObject::count)",&_kjCondition,
               (int *)&local_4f8,&(anonymous_namespace)::TestObject::count);
  }
  (anonymous_namespace)::TestObject::throwAt = 0x10;
  array.ptr = firstElement;
  if (firstElement != (TestObject *)0x0) {
    array.ptr = (TestObject *)0x0;
    array.size_ = 0;
    _::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&_::HeapArrayDisposer::instance,firstElement,4,0x20,0x20,
               ArrayDisposer::Dispose_<kj::(anonymous_namespace)::TestObject>::destruct);
  }
  local_360[0].ptr.isSet = false;
  Maybe<kj::Exception>::Maybe((Maybe<kj::Exception> *)&local_4f8,local_360);
  bVar1 = local_4f8.isSet;
  Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&local_4f8);
  if (local_4f8.isSet == true) {
    Exception::~Exception(&local_4f8.field_1.value);
  }
  if (local_360[0].ptr.isSet == true) {
    Exception::~Exception(&local_360[0].ptr.field_1.value);
  }
  if ((bVar1 == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x94,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { array = nullptr; }) != kj::none\", _kjCondition"
               ,(char (*) [85])
                "failed: expected ::kj::runCatchingExceptions([&]() { array = nullptr; }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)&_kjCondition);
  }
  if ((char)_kjCondition.left == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  _kjCondition.result = (anonymous_namespace)::TestObject::count == 0;
  _kjCondition.left = 0;
  _kjCondition.right = &(anonymous_namespace)::TestObject::count;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (_::Debug::minSeverity < 3)) {
    local_4f8.isSet = false;
    local_4f8._1_3_ = 0;
    _::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x95,ERROR,
               "\"failed: expected \" \"(0) == (TestObject::count)\", _kjCondition, 0, TestObject::count"
               ,(char (*) [44])"failed: expected (0) == (TestObject::count)",&_kjCondition,
               (int *)&local_4f8,&(anonymous_namespace)::TestObject::count);
  }
  if (array.ptr != (TestObject *)0x0) {
    _::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&_::HeapArrayDisposer::instance,array.ptr,4,array.size_,
               array.size_,ArrayDisposer::Dispose_<kj::(anonymous_namespace)::TestObject>::destruct)
    ;
  }
  return;
}

Assistant:

TEST(Array, ThrowingDestructor) {
  TestObject::count = 0;
  TestObject::throwAt = -1;

  Array<TestObject> array = heapArray<TestObject>(32);
  EXPECT_EQ(32, TestObject::count);

  // If a destructor throws, all elements should still be destroyed.
  TestObject::throwAt = 16;
  EXPECT_ANY_THROW(array = nullptr);
  EXPECT_EQ(0, TestObject::count);
}